

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utScenePreprocessor.cpp
# Opt level: O2

aiAnimation * MakeDummyAnimation(void)

{
  aiAnimation *this;
  aiNodeAnim **ppaVar1;
  aiNodeAnim *this_00;
  
  this = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(this);
  this->mNumChannels = 1;
  ppaVar1 = (aiNodeAnim **)operator_new__(8);
  this->mChannels = ppaVar1;
  this_00 = (aiNodeAnim *)operator_new(0x438);
  (this_00->mNodeName).length = 0;
  (this_00->mNodeName).data[0] = '\0';
  memset((this_00->mNodeName).data + 1,0x1b,0x3ff);
  this_00->mRotationKeys = (aiQuatKey *)0x0;
  this_00->mNumScalingKeys = 0;
  *(undefined8 *)&this_00->mNumPositionKeys = 0;
  *(undefined8 *)((long)&this_00->mPositionKeys + 4) = 0;
  this_00->mScalingKeys = (aiVectorKey *)0x0;
  this_00->mPreState = aiAnimBehaviour_DEFAULT;
  this_00->mPostState = aiAnimBehaviour_DEFAULT;
  *ppaVar1 = this_00;
  aiString::Set((aiString *)this_00,"<test>");
  return this;
}

Assistant:

aiAnimation* MakeDummyAnimation() {
    aiAnimation* p = new aiAnimation();
    p->mNumChannels = 1;
    p->mChannels = new aiNodeAnim*[1];
    aiNodeAnim* anim = p->mChannels[0] = new aiNodeAnim();
    anim->mNodeName.Set("<test>");
    return p;
}